

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O2

bool __thiscall
Rml::DataControllerEvent::Initialize
          (DataControllerEvent *this,DataModel *model,Element *element,String *expression_str,
          String *modifier)

{
  pointer pcVar1;
  code *pcVar2;
  _Alloc_hider __p;
  bool bVar3;
  EventId id;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  DataExpressionInterface expr_interface;
  
  if (element == (Element *)0x0) {
    bVar3 = Assert("RMLUI_ASSERT(element)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataControllerDefault.cpp"
                   ,0x6b);
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  ::std::make_unique<Rml::DataExpression,std::__cxx11::string_const&>(&local_68);
  __p._M_p = local_68._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)0x0;
  ::std::__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::reset
            ((__uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
             &this->expression,(pointer)__p._M_p);
  ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::~unique_ptr
            ((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)&local_68
            );
  bVar4 = false;
  DataExpressionInterface::DataExpressionInterface(&expr_interface,model,element,(Event *)0x0);
  bVar3 = DataExpression::Parse
                    ((this->expression)._M_t.
                     super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                     .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl,
                     &expr_interface,true);
  if (bVar3) {
    id = EventSpecificationInterface::GetIdOrInsert(modifier);
    this->id = id;
    if (id == Invalid) {
      pcVar1 = (modifier->_M_dataplus)._M_p;
      Element::GetAddress_abi_cxx11_(&local_68,element,false,true);
      Log::Message(LT_WARNING,
                   "Event type \'%s\' could not be recognized, while adding \'data-event\' to %s",
                   pcVar1,local_68._M_dataplus._M_p);
      ::std::__cxx11::string::~string((string *)&local_68);
      bVar4 = false;
    }
    else {
      Element::AddEventListener(element,id,&this->super_EventListener,false);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool DataControllerEvent::Initialize(DataModel& model, Element* element, const String& expression_str, const String& modifier)
{
	RMLUI_ASSERT(element);

	expression = MakeUnique<DataExpression>(expression_str);
	DataExpressionInterface expr_interface(&model, element);

	if (!expression->Parse(expr_interface, true))
		return false;

	id = EventSpecificationInterface::GetIdOrInsert(modifier);
	if (id == EventId::Invalid)
	{
		Log::Message(Log::LT_WARNING, "Event type '%s' could not be recognized, while adding 'data-event' to %s", modifier.c_str(),
			element->GetAddress().c_str());
		return false;
	}

	element->AddEventListener(id, this);

	return true;
}